

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::RemoveFromIndexes
          (RowGroupCollection *this,TableIndexList *indexes,Vector *row_identifiers,idx_t count)

{
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *puVar1;
  _Hash_node_base *params;
  idx_t row_number;
  idx_t iVar2;
  pointer puVar3;
  long lVar4;
  pointer pSVar5;
  int iVar6;
  type pIVar7;
  ulong uVar8;
  reference pvVar9;
  DataTableInfo *pDVar10;
  Allocator *pAVar11;
  _Hash_node_base *p_Var12;
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  reference pvVar13;
  reference other;
  BoundIndex *this_02;
  InternalException *pIVar14;
  MissingExtensionException *this_03;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *this_04;
  shared_ptr<duckdb::DataTableInfo,_true> *this_05;
  _Hash_node_base *p_Var15;
  _Hash_node_base *p_Var16;
  ulong uVar17;
  ulong uVar18;
  size_type __n;
  StorageIndex *col;
  pointer pSVar19;
  pointer this_06;
  vector<duckdb::StorageIndex,_true> column_ids;
  vector<bool,_true> fetched_columns;
  vector<duckdb::LogicalType,_true> column_types;
  size_type __dnew;
  SelectionVector sel;
  DataChunk result_chunk;
  DataChunk fetch_chunk;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  indexed_column_id_set;
  TableScanState state;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_438;
  idx_t local_418;
  vector<bool,_true> local_410;
  vector<duckdb::LogicalType,_true> *local_3e8;
  data_ptr_t local_3e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d8;
  shared_ptr<duckdb::DataTableInfo,_true> *local_3b8;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *local_3b0;
  Vector *local_3a8;
  Value local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  SelectionVector local_340;
  DataChunk local_328;
  DataChunk local_2e8;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_2a8;
  LogicalType local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [40];
  size_t local_230;
  __node_base_ptr p_Stack_228;
  string local_220;
  TableScanState local_200;
  
  local_3e0 = row_identifiers->data;
  local_258._0_8_ = &p_Stack_228;
  local_258._8_8_ = 1;
  local_258._16_8_ = (_Hash_node_base *)0x0;
  local_258._24_8_ = 0;
  local_258._32_4_ = 1.0;
  local_230 = 0;
  p_Stack_228 = (__node_base_ptr)0x0;
  local_3a8 = row_identifiers;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)indexes);
  if (iVar6 != 0) {
    ::std::__throw_system_error(iVar6);
  }
  this_04 = (indexes->indexes).
            super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (indexes->indexes).
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_04 != puVar1) {
    do {
      pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                         (this_04);
      local_200.table_state.row_group = (RowGroup *)local_258;
      for (p_Var15 = (pIVar7->column_id_set)._M_h._M_before_begin._M_nxt;
          p_Var15 != (_Hash_node_base *)0x0; p_Var15 = p_Var15->_M_nxt) {
        ::std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_258,p_Var15 + 1,&local_200);
      }
      this_04 = this_04 + 1;
    } while (this_04 != puVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)indexes);
  local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((_Hash_node_base *)local_258._16_8_ != (_Hash_node_base *)0x0) {
    p_Var15 = (_Hash_node_base *)local_258._16_8_;
    do {
      ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
      emplace_back<unsigned_long_const&>
                ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&local_438,
                 (unsigned_long *)(p_Var15 + 1));
      p_Var15 = p_Var15->_M_nxt;
    } while (p_Var15 != (_Hash_node_base *)0x0);
  }
  pSVar19 = local_438.
            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pSVar5 = local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = (long)local_438.
                  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_438.
                  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 5;
    lVar4 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::StorageIndex*,std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_438.
               super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_438.
               super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb::StorageIndex*,std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar5,pSVar19);
  }
  pSVar5 = local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_3d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pSVar19 = local_438.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pvVar9 = vector<duckdb::LogicalType,_true>::operator[](&this->types,pSVar19->index);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_3d8,pvVar9);
      pSVar19 = pSVar19 + 1;
    } while (pSVar19 != pSVar5);
  }
  TableScanState::TableScanState(&local_200);
  local_2a8.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2a8.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_2a8.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableScanState::Initialize
            (&local_200,(vector<duckdb::StorageIndex,_true> *)&local_2a8,
             (optional_ptr<duckdb::ClientContext,_true>)0x0,
             (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
             (optional_ptr<duckdb::SampleOptions,_true>)0x0);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_2a8);
  local_200.table_state.max_row =
       (this->total_rows).super___atomic_base<unsigned_long>._M_i + this->row_start;
  DataChunk::DataChunk(&local_2e8);
  this_05 = &this->info;
  pDVar10 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_05);
  pAVar11 = Allocator::Get(pDVar10->db);
  DataChunk::Initialize(&local_2e8,pAVar11,(vector<duckdb::LogicalType,_true> *)&local_3d8,0x800);
  DataChunk::DataChunk(&local_328);
  local_3a0.type_._0_8_ = local_3a0.type_._0_8_ & 0xffffffffffffff00;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_410,
             ((long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (bool *)&local_3a0,(allocator_type *)&local_360);
  local_3b8 = this_05;
  pDVar10 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_05);
  pAVar11 = Allocator::Get(pDVar10->db);
  local_3e8 = &this->types;
  DataChunk::Initialize(&local_328,pAVar11,local_3e8,&local_410,0x800);
  if ((_Hash_node_base *)local_258._16_8_ != (_Hash_node_base *)0x0) {
    p_Var15 = (_Hash_node_base *)
              ((ulong)local_410.super_vector<bool,_std::allocator<bool>_>.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_finish.super__Bit_iterator_base._M_offset +
              ((long)local_410.super_vector<bool,_std::allocator<bool>_>.
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_finish.super__Bit_iterator_base._M_p -
              (long)local_410.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p) * 8);
    p_Var12 = (_Hash_node_base *)local_258._16_8_;
    do {
      params = p_Var12[1]._M_nxt;
      if (p_Var15 <= params) {
        pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
        local_3a0.type_._0_8_ =
             &local_3a0.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3a0,"Attempted to access index %ld within vector of size %ld",""
                  );
        InternalException::InternalException<unsigned_long,unsigned_long>
                  (pIVar14,(string *)&local_3a0,(unsigned_long)params,(unsigned_long)p_Var15);
        __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      p_Var16 = (_Hash_node_base *)((long)&params[7]._M_nxt + 7);
      if (-1 < (long)params) {
        p_Var16 = params;
      }
      local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
      [((long)p_Var16 >> 6) +
       ((ulong)(((ulong)params & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_410.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p
           [((long)p_Var16 >> 6) +
            ((ulong)(((ulong)params & 0x800000000000003f) < 0x8000000000000001) - 1)] |
           1L << ((byte)params & 0x3f);
      p_Var12 = p_Var12->_M_nxt;
    } while (p_Var12 != (_Hash_node_base *)0x0);
  }
  SelectionVector::SelectionVector(&local_340,0x800);
  if (count != 0) {
    local_3b0 = &this->row_groups;
    uVar8 = 0;
    do {
      DataChunk::Reset(&local_2e8);
      DataChunk::Reset(&local_328);
      row_number = *(idx_t *)(local_3e0 + uVar8 * 8);
      this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(local_3b0);
      this_01 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                          (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,row_number);
      iVar2 = (this_01->super_SegmentBase<duckdb::RowGroup>).start;
      CollectionScanState::Initialize(&local_200.table_state,local_3e8);
      uVar17 = row_number - iVar2;
      RowGroup::InitializeScanWithOffset(this_01,&local_200.table_state,uVar17 >> 0xb);
      RowGroup::ScanCommitted(this_01,&local_200.table_state,&local_2e8,TABLE_SCAN_COMMITTED_ROWS);
      DataChunk::Verify(&local_2e8);
      if (uVar8 < count) {
        uVar18 = (uVar17 & 0xfffffffffffff800) + iVar2;
        local_418 = 0;
        uVar17 = uVar8;
        do {
          uVar8 = uVar17;
          uVar17 = *(ulong *)(local_3e0 + uVar8 * 8);
          if (local_2e8.count + uVar18 <= uVar17 || uVar17 < uVar18) break;
          local_340.sel_vector[local_418] = (int)uVar17 - (int)uVar18;
          local_418 = local_418 + 1;
          uVar17 = uVar8 + 1;
          uVar8 = count;
        } while (count != uVar17);
      }
      else {
        local_418 = 0;
      }
      if ((this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar17 = 0;
        __n = 0;
        do {
          uVar18 = (ulong)local_410.super_vector<bool,_std::allocator<bool>_>.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                   ((long)local_410.super_vector<bool,_std::allocator<bool>_>.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                   (long)local_410.super_vector<bool,_std::allocator<bool>_>.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p) * 8;
          if (uVar18 <= uVar17) {
            pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
            local_3a0.type_._0_8_ =
                 &local_3a0.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            local_360._M_dataplus._M_p = &DAT_00000037;
            local_3a0.type_._0_8_ =
                 ::std::__cxx11::string::_M_create((ulong *)&local_3a0,(ulong)&local_360);
            local_3a0.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_dataplus._M_p;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a0.type_._0_8_ + 0x20))->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x636576206e696874;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a0.type_._0_8_ + 0x28))->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7320666f20726f74;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a0.type_._0_8_ + 0x10))->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x65646e6920737365;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a0.type_._0_8_ + 0x18))->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x697720646c252078;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_3a0.type_._0_8_)->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6574706d65747441;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a0.type_._0_8_ + 8))->_M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x636361206f742064;
            builtin_strncpy((char *)((long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                            (local_3a0.type_._0_8_ + 0x28))->_M_pi + 7),"size %ld",8
                           );
            local_3a0.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_360._M_dataplus._M_p;
            local_360._M_dataplus._M_p[local_3a0.type_._0_8_] = '\0';
            InternalException::InternalException<unsigned_long,unsigned_long>
                      (pIVar14,(string *)&local_3a0,uVar17,uVar18);
            __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar18 = uVar17 + 0x3f;
          if (-1 < (long)uVar17) {
            uVar18 = uVar17;
          }
          if ((local_410.super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p
               [((long)uVar18 >> 6) +
                ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar17 & 0x3f) & 1) == 0) {
            pvVar13 = vector<duckdb::Vector,_true>::operator[](&local_328.data,uVar17);
            pvVar9 = vector<duckdb::LogicalType,_true>::operator[](local_3e8,uVar17);
            LogicalType::LogicalType(&local_290,pvVar9);
            Value::Value(&local_3a0,&local_290);
            Vector::Reference(pvVar13,&local_3a0);
            Value::~Value(&local_3a0);
            LogicalType::~LogicalType(&local_290);
          }
          else {
            pvVar13 = vector<duckdb::Vector,_true>::operator[](&local_328.data,uVar17);
            other = vector<duckdb::Vector,_true>::operator[](&local_2e8.data,__n);
            Vector::Reference(pvVar13,other);
            __n = __n + 1;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < (ulong)(((long)(this->types).
                                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                         .
                                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->types).
                                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                         .
                                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_328.count = local_2e8.count;
      DataChunk::Slice(&local_328,&local_340,local_418);
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)indexes);
      if (iVar6 != 0) {
        ::std::__throw_system_error(iVar6);
      }
      puVar3 = (indexes->indexes).
               super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_06 = (indexes->indexes).
                     super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_06 != puVar3;
          this_06 = this_06 + 1) {
        this_02 = (BoundIndex *)
                  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                            (this_06);
        iVar6 = (*(this_02->super_Index)._vptr_Index[2])(this_02);
        if ((char)iVar6 == '\0') {
          this_03 = (MissingExtensionException *)__cxa_allocate_exception(0x10);
          local_3a0.type_._0_8_ =
               &local_3a0.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3a0,
                     "Cannot delete from index \'%s\', unknown index type \'%s\'. You need to load the extension that provides this index type before table \'%s\' can be modified."
                     ,"");
          iVar6 = (*(this_02->super_Index)._vptr_Index[4])(this_02);
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          lVar4 = *(long *)CONCAT44(extraout_var,iVar6);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_360,lVar4,((long *)CONCAT44(extraout_var,iVar6))[1] + lVar4);
          iVar6 = (*(this_02->super_Index)._vptr_Index[3])(this_02);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          lVar4 = *(long *)CONCAT44(extraout_var_00,iVar6);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,lVar4,((long *)CONCAT44(extraout_var_00,iVar6))[1] + lVar4
                    );
          pDVar10 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(local_3b8);
          DataTableInfo::GetTableName_abi_cxx11_(&local_220,pDVar10);
          MissingExtensionException::
          MissingExtensionException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (this_03,(string *)&local_3a0,&local_360,&local_278,&local_220);
          __cxa_throw(this_03,&MissingExtensionException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        BoundIndex::Delete(this_02,&local_328,local_3a8);
      }
      pthread_mutex_unlock((pthread_mutex_t *)indexes);
    } while (uVar8 < count);
  }
  if (local_340.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_340.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
  {
    operator_delete(local_410.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
    local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  DataChunk::~DataChunk(&local_328);
  DataChunk::~DataChunk(&local_2e8);
  TableScanState::~TableScanState(&local_200);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d8);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_438);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_258);
  return;
}

Assistant:

void RowGroupCollection::RemoveFromIndexes(TableIndexList &indexes, Vector &row_identifiers, idx_t count) {
	auto row_ids = FlatVector::GetData<row_t>(row_identifiers);

	// Collect all indexed columns.
	unordered_set<column_t> indexed_column_id_set;
	indexes.Scan([&](Index &index) {
		D_ASSERT(index.IsBound());
		auto &set = index.GetColumnIdSet();
		indexed_column_id_set.insert(set.begin(), set.end());
		return false;
	});
	vector<StorageIndex> column_ids;
	for (auto &col : indexed_column_id_set) {
		column_ids.emplace_back(col);
	}
	sort(column_ids.begin(), column_ids.end());

	vector<LogicalType> column_types;
	for (auto &col : column_ids) {
		column_types.push_back(types[col.GetPrimaryIndex()]);
	}

	// Initialize the fetch state. Only use indexed columns.
	TableScanState state;
	state.Initialize(std::move(column_ids));
	state.table_state.max_row = row_start + total_rows;

	// Used for scanning data. Only contains the indexed columns.
	DataChunk fetch_chunk;
	fetch_chunk.Initialize(GetAllocator(), column_types);

	// Used for index value removal.
	// Contains all columns but only initializes indexed ones.
	DataChunk result_chunk;
	auto fetched_columns = vector<bool>(types.size(), false);
	result_chunk.Initialize(GetAllocator(), types, fetched_columns);

	// Now set all to-be-fetched columns.
	for (auto &col : indexed_column_id_set) {
		fetched_columns[col] = true;
	}

	// Iterate over the row ids.
	SelectionVector sel(STANDARD_VECTOR_SIZE);
	for (idx_t r = 0; r < count;) {
		fetch_chunk.Reset();
		result_chunk.Reset();

		// Figure out which row_group to fetch from.
		auto row_id = row_ids[r];
		auto row_group = row_groups->GetSegment(UnsafeNumericCast<idx_t>(row_id));
		auto row_group_vector_idx = (UnsafeNumericCast<idx_t>(row_id) - row_group->start) / STANDARD_VECTOR_SIZE;
		auto base_row_id = row_group_vector_idx * STANDARD_VECTOR_SIZE + row_group->start;

		// Fetch the current vector into fetch_chunk.
		state.table_state.Initialize(GetTypes());
		row_group->InitializeScanWithOffset(state.table_state, row_group_vector_idx);
		row_group->ScanCommitted(state.table_state, fetch_chunk, TableScanType::TABLE_SCAN_COMMITTED_ROWS);
		fetch_chunk.Verify();

		// Check for any remaining row ids, if they also fall into this vector.
		// We try to fetch as many rows as possible at the same time.
		idx_t sel_count = 0;
		for (; r < count; r++) {
			idx_t current_row = idx_t(row_ids[r]);
			if (current_row < base_row_id || current_row >= base_row_id + fetch_chunk.size()) {
				// This row id does not fall into the current chunk.
				break;
			}
			auto row_in_vector = current_row - base_row_id;
			D_ASSERT(row_in_vector < fetch_chunk.size());
			sel.set_index(sel_count++, row_in_vector);
		}
		D_ASSERT(sel_count > 0);

		// Reference the necessary columns of the fetch_chunk.
		idx_t fetch_idx = 0;
		for (idx_t j = 0; j < types.size(); j++) {
			if (fetched_columns[j]) {
				result_chunk.data[j].Reference(fetch_chunk.data[fetch_idx++]);
				continue;
			}
			result_chunk.data[j].Reference(Value(types[j]));
		}
		result_chunk.SetCardinality(fetch_chunk);

		// Slice the vector with all rows that are present in this vector.
		// Then, erase all values from the indexes.
		result_chunk.Slice(sel, sel_count);
		indexes.Scan([&](Index &index) {
			if (index.IsBound()) {
				index.Cast<BoundIndex>().Delete(result_chunk, row_identifiers);
				return false;
			}
			throw MissingExtensionException(
			    "Cannot delete from index '%s', unknown index type '%s'. You need to load the "
			    "extension that provides this index type before table '%s' can be modified.",
			    index.GetIndexName(), index.GetIndexType(), info->GetTableName());
		});
	}
}